

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::EventLog::SetSnapshotOrInflateInProgress(EventLog *this,bool flag)

{
  int iVar1;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  ScriptContext **ppSVar2;
  int local_24;
  int32 i;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *contexts;
  bool flag_local;
  EventLog *this_local;
  
  this_00 = ThreadContextTTD::GetTTDContexts(this->m_threadContext->TTDContext);
  local_24 = 0;
  while( true ) {
    iVar1 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::Count
                      (&this_00->
                        super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                      );
    if (iVar1 <= local_24) {
      return;
    }
    ppSVar2 = JsUtil::
              List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,local_24);
    if ((bool)((*ppSVar2)->TTDSnapshotOrInflateInProgress & 1U) == flag) break;
    ppSVar2 = JsUtil::
              List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,local_24);
    (*ppSVar2)->TTDSnapshotOrInflateInProgress = flag;
    local_24 = local_24 + 1;
  }
  TTDAbort_unrecoverable_error("This is not re-entrant!!!");
}

Assistant:

void EventLog::SetSnapshotOrInflateInProgress(bool flag)
    {
        const JsUtil::List<Js::ScriptContext*, HeapAllocator>& contexts = this->m_threadContext->TTDContext->GetTTDContexts();
        for(int32 i = 0; i < contexts.Count(); ++i)
        {
            TTDAssert(contexts.Item(i)->TTDSnapshotOrInflateInProgress != flag, "This is not re-entrant!!!");

            contexts.Item(i)->TTDSnapshotOrInflateInProgress = flag;
        }
    }